

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_add_ge(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b)

{
  uint64_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  uint uVar658;
  uint uVar659;
  ulong uVar660;
  ulong uVar661;
  ulong uVar662;
  ulong uVar663;
  ulong uVar664;
  uint64_t mask0_1;
  long lVar665;
  ulong uVar666;
  ulong uVar667;
  ulong uVar668;
  ulong uVar669;
  ulong uVar670;
  ulong uVar671;
  ulong uVar672;
  ulong uVar673;
  ulong uVar674;
  uint64_t uVar675;
  ulong uVar676;
  ulong uVar677;
  ulong uVar678;
  ulong uVar679;
  uint64_t uVar680;
  secp256k1_fe *psVar681;
  ulong uVar682;
  ulong uVar683;
  ulong uVar684;
  uint64_t uVar685;
  ulong uVar686;
  ulong uVar687;
  ulong uVar688;
  ulong uVar689;
  ulong uVar690;
  ulong uVar691;
  ulong uVar692;
  ulong uVar693;
  ulong uVar694;
  ulong uVar695;
  ulong uVar696;
  ulong uVar697;
  ulong uVar698;
  ulong uVar699;
  uint64_t uVar700;
  uint64_t mask0;
  ulong uVar701;
  uint64_t uVar702;
  ulong uVar703;
  ulong uVar704;
  ulong uVar705;
  ulong uVar706;
  uint64_t tmp3_5;
  uint64_t tmp2_6;
  uint64_t tmp3_6;
  secp256k1_fe t;
  secp256k1_fe n;
  secp256k1_fe u1;
  secp256k1_fe q;
  secp256k1_fe tt;
  uint64_t tmp3_4;
  secp256k1_fe m_alt;
  uint64_t tmp3_1;
  secp256k1_fe u2;
  secp256k1_fe s2;
  secp256k1_fe zz;
  secp256k1_fe rr;
  secp256k1_fe local_f8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  long local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  secp256k1_fe local_58;
  
  psVar681 = &a->z;
  uVar678 = psVar681->n[0];
  uVar688 = (a->z).n[1];
  uVar692 = (a->z).n[2];
  uVar666 = (a->z).n[3];
  uVar667 = (a->z).n[4];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar678 * 2;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = uVar666;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar688 * 2;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = uVar692;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar667;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = uVar667;
  uVar660 = SUB168(auVar4 * auVar314,0);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar660 & 0xfffffffffffff;
  auVar2 = auVar3 * auVar313 + auVar2 * auVar312 + auVar5 * ZEXT816(0x1000003d10);
  uVar676 = auVar2._0_8_;
  auVar574._8_8_ = 0;
  auVar574._0_8_ = uVar676 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar667 = uVar667 * 2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar678;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = uVar667;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar688 * 2;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = uVar666;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar692;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = uVar692;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar660 >> 0x34 | SUB168(auVar4 * auVar314,8) << 0xc;
  auVar2 = auVar6 * auVar315 + auVar574 + auVar7 * auVar316 + auVar8 * auVar317 +
           auVar9 * ZEXT816(0x1000003d10);
  uVar660 = auVar2._0_8_;
  auVar575._8_8_ = 0;
  auVar575._0_8_ = uVar660 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar678;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = uVar678;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar688;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = uVar667;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar692 * 2;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = uVar666;
  auVar2 = auVar11 * auVar319 + auVar575 + auVar12 * auVar320;
  uVar677 = auVar2._0_8_;
  auVar577._8_8_ = 0;
  auVar577._0_8_ = uVar677 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = (uVar677 & 0xfffffffffffff) << 4 | (uVar660 & 0xfffffffffffff) >> 0x30;
  auVar2 = auVar10 * auVar318 + ZEXT816(0x1000003d1) * auVar321;
  uVar677 = auVar2._0_8_;
  local_80 = uVar677 & 0xfffffffffffff;
  auVar576._8_8_ = 0;
  auVar576._0_8_ = uVar677 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar678 * 2;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = uVar688;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar692;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = uVar667;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar666;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = uVar666;
  auVar3 = auVar14 * auVar323 + auVar577 + auVar15 * auVar324;
  uVar677 = auVar3._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar677 & 0xfffffffffffff;
  auVar2 = auVar13 * auVar322 + auVar576 + auVar16 * ZEXT816(0x1000003d10);
  uVar687 = auVar2._0_8_;
  auVar579._8_8_ = 0;
  auVar579._0_8_ = uVar677 >> 0x34 | auVar3._8_8_ << 0xc;
  local_78 = uVar687 & 0xfffffffffffff;
  auVar578._8_8_ = 0;
  auVar578._0_8_ = uVar687 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar678 * 2;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = uVar692;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar688;
  auVar326._8_8_ = 0;
  auVar326._0_8_ = uVar688;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar666;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = uVar667;
  auVar579 = auVar19 * auVar327 + auVar579;
  uVar678 = auVar579._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar678 & 0xfffffffffffff;
  auVar2 = auVar17 * auVar325 + auVar578 + auVar18 * auVar326 + auVar20 * ZEXT816(0x1000003d10);
  uVar688 = auVar2._0_8_;
  local_70 = uVar688 & 0xfffffffffffff;
  auVar580._8_8_ = 0;
  auVar580._0_8_ = (uVar688 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar676 & 0xfffffffffffff);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar678 >> 0x34 | auVar579._8_8_ << 0xc;
  auVar580 = auVar21 * ZEXT816(0x1000003d10) + auVar580;
  uVar678 = auVar580._0_8_;
  local_68 = uVar678 & 0xfffffffffffff;
  local_60 = (uVar678 >> 0x34 | auVar580._8_8_ << 0xc) + (uVar660 & 0xffffffffffff);
  uVar678 = (a->x).n[4];
  uVar687 = (uVar678 >> 0x30) * 0x1000003d1 + (a->x).n[0];
  uVar672 = (uVar687 >> 0x34) + (a->x).n[1];
  uVar682 = (uVar672 >> 0x34) + (a->x).n[2];
  uVar687 = uVar687 & 0xfffffffffffff;
  uVar672 = uVar672 & 0xfffffffffffff;
  uVar686 = (uVar682 >> 0x34) + (a->x).n[3];
  uVar682 = uVar682 & 0xfffffffffffff;
  uVar689 = (uVar686 >> 0x34) + (uVar678 & 0xffffffffffff);
  uVar686 = uVar686 & 0xfffffffffffff;
  uVar678 = (b->x).n[0];
  uVar688 = (b->x).n[1];
  uVar692 = (b->x).n[2];
  uVar666 = (b->x).n[3];
  uVar667 = (b->x).n[4];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_80;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = uVar666;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_78;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = uVar692;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_70;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = uVar688;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_68;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = uVar678;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_60;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = uVar667;
  uVar660 = SUB168(auVar26 * auVar332,0);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar660 & 0xfffffffffffff;
  auVar2 = auVar23 * auVar329 + auVar22 * auVar328 + auVar24 * auVar330 + auVar25 * auVar331 +
           auVar27 * ZEXT816(0x1000003d10);
  uVar676 = auVar2._0_8_;
  auVar581._8_8_ = 0;
  auVar581._0_8_ = uVar676 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_80;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = uVar667;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_78;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = uVar666;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_70;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = uVar692;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_68;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = uVar688;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_60;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = uVar678;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar660 >> 0x34 | SUB168(auVar26 * auVar332,8) << 0xc;
  auVar2 = auVar28 * auVar333 + auVar581 + auVar29 * auVar334 + auVar30 * auVar335 +
           auVar31 * auVar336 + auVar32 * auVar337 + auVar33 * ZEXT816(0x1000003d10);
  uVar660 = auVar2._0_8_;
  auVar582._8_8_ = 0;
  auVar582._0_8_ = uVar660 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_80;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = uVar678;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_78;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = uVar667;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_70;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uVar666;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_68;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = uVar692;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_60;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = uVar688;
  auVar2 = auVar35 * auVar339 + auVar582 + auVar36 * auVar340 + auVar37 * auVar341 +
           auVar38 * auVar342;
  uVar677 = auVar2._0_8_;
  auVar584._8_8_ = 0;
  auVar584._0_8_ = uVar677 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = (uVar677 & 0xfffffffffffff) << 4 | (uVar660 & 0xfffffffffffff) >> 0x30;
  auVar2 = auVar34 * auVar338 + ZEXT816(0x1000003d1) * auVar343;
  uVar677 = auVar2._0_8_;
  local_d0 = uVar677 & 0xfffffffffffff;
  auVar583._8_8_ = 0;
  auVar583._0_8_ = uVar677 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_80;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = uVar688;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_78;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = uVar678;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_70;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = uVar667;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_68;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = uVar666;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_60;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = uVar692;
  auVar3 = auVar41 * auVar346 + auVar584 + auVar42 * auVar347 + auVar43 * auVar348;
  uVar677 = auVar3._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar677 & 0xfffffffffffff;
  auVar2 = auVar39 * auVar344 + auVar583 + auVar40 * auVar345 + auVar44 * ZEXT816(0x1000003d10);
  uVar690 = auVar2._0_8_;
  auVar586._8_8_ = 0;
  auVar586._0_8_ = uVar677 >> 0x34 | auVar3._8_8_ << 0xc;
  local_c8 = uVar690 & 0xfffffffffffff;
  auVar585._8_8_ = 0;
  auVar585._0_8_ = uVar690 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_80;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = uVar692;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_78;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = uVar688;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_70;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = uVar678;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_68;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = uVar667;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_60;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = uVar666;
  auVar3 = auVar48 * auVar352 + auVar586 + auVar49 * auVar353;
  uVar678 = auVar3._0_8_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar678 & 0xfffffffffffff;
  auVar2 = auVar45 * auVar349 + auVar585 + auVar46 * auVar350 + auVar47 * auVar351 +
           auVar50 * ZEXT816(0x1000003d10);
  uVar688 = auVar2._0_8_;
  local_c0 = uVar688 & 0xfffffffffffff;
  auVar587._8_8_ = 0;
  auVar587._0_8_ = (uVar688 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar676 & 0xfffffffffffff);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar678 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar587 = auVar51 * ZEXT816(0x1000003d10) + auVar587;
  uVar678 = auVar587._0_8_;
  local_b8 = uVar678 & 0xfffffffffffff;
  local_b0 = (uVar678 >> 0x34 | auVar587._8_8_ << 0xc) + (uVar660 & 0xffffffffffff);
  uVar678 = (a->y).n[4];
  uVar673 = (uVar678 >> 0x30) * 0x1000003d1 + (a->y).n[0];
  uVar683 = (uVar673 >> 0x34) + (a->y).n[1];
  uVar674 = (uVar683 >> 0x34) + (a->y).n[2];
  uVar673 = uVar673 & 0xfffffffffffff;
  uVar683 = uVar683 & 0xfffffffffffff;
  uVar684 = (uVar674 >> 0x34) + (a->y).n[3];
  uVar674 = uVar674 & 0xfffffffffffff;
  lVar665 = (uVar684 >> 0x34) + (uVar678 & 0xffffffffffff);
  uVar684 = uVar684 & 0xfffffffffffff;
  uVar678 = (b->y).n[0];
  uVar688 = (b->y).n[1];
  uVar692 = (b->y).n[2];
  uVar666 = (b->y).n[3];
  uVar667 = (b->y).n[4];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_80;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = uVar666;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_78;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = uVar692;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_70;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = uVar688;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_68;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = uVar678;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = local_60;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = uVar667;
  uVar660 = SUB168(auVar56 * auVar358,0);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar660 & 0xfffffffffffff;
  auVar2 = auVar53 * auVar355 + auVar52 * auVar354 + auVar54 * auVar356 + auVar55 * auVar357 +
           auVar57 * ZEXT816(0x1000003d10);
  uVar677 = auVar2._0_8_;
  auVar588._8_8_ = 0;
  auVar588._0_8_ = uVar677 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = local_80;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = uVar667;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = local_78;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = uVar666;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_70;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = uVar692;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_68;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = uVar688;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_60;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = uVar678;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar660 >> 0x34 | SUB168(auVar56 * auVar358,8) << 0xc;
  auVar2 = auVar58 * auVar359 + auVar588 + auVar59 * auVar360 + auVar60 * auVar361 +
           auVar61 * auVar362 + auVar62 * auVar363 + auVar63 * ZEXT816(0x1000003d10);
  uVar690 = auVar2._0_8_;
  auVar589._8_8_ = 0;
  auVar589._0_8_ = uVar690 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = local_80;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = uVar678;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = local_78;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = uVar667;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = local_70;
  auVar366._8_8_ = 0;
  auVar366._0_8_ = uVar666;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = local_68;
  auVar367._8_8_ = 0;
  auVar367._0_8_ = uVar692;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = local_60;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = uVar688;
  auVar2 = auVar65 * auVar365 + auVar589 + auVar66 * auVar366 + auVar67 * auVar367 +
           auVar68 * auVar368;
  uVar660 = auVar2._0_8_;
  auVar591._8_8_ = 0;
  auVar591._0_8_ = uVar660 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar369._8_8_ = 0;
  auVar369._0_8_ = (uVar660 & 0xfffffffffffff) << 4 | (uVar690 & 0xfffffffffffff) >> 0x30;
  auVar2 = auVar64 * auVar364 + ZEXT816(0x1000003d1) * auVar369;
  uVar676 = auVar2._0_8_;
  uVar660 = uVar676 & 0xfffffffffffff;
  auVar590._8_8_ = 0;
  auVar590._0_8_ = uVar676 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = local_80;
  auVar370._8_8_ = 0;
  auVar370._0_8_ = uVar688;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = local_78;
  auVar371._8_8_ = 0;
  auVar371._0_8_ = uVar678;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_70;
  auVar372._8_8_ = 0;
  auVar372._0_8_ = uVar667;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = local_68;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = uVar666;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = local_60;
  auVar374._8_8_ = 0;
  auVar374._0_8_ = uVar692;
  auVar3 = auVar71 * auVar372 + auVar591 + auVar72 * auVar373 + auVar73 * auVar374;
  uVar676 = auVar3._0_8_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar676 & 0xfffffffffffff;
  auVar2 = auVar69 * auVar370 + auVar590 + auVar70 * auVar371 + auVar74 * ZEXT816(0x1000003d10);
  uVar691 = auVar2._0_8_;
  auVar593._8_8_ = 0;
  auVar593._0_8_ = uVar676 >> 0x34 | auVar3._8_8_ << 0xc;
  uVar676 = uVar691 & 0xfffffffffffff;
  auVar592._8_8_ = 0;
  auVar592._0_8_ = uVar691 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = local_80;
  auVar375._8_8_ = 0;
  auVar375._0_8_ = uVar692;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = local_78;
  auVar376._8_8_ = 0;
  auVar376._0_8_ = uVar688;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = local_70;
  auVar377._8_8_ = 0;
  auVar377._0_8_ = uVar678;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = local_68;
  auVar378._8_8_ = 0;
  auVar378._0_8_ = uVar667;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = local_60;
  auVar379._8_8_ = 0;
  auVar379._0_8_ = uVar666;
  auVar3 = auVar78 * auVar378 + auVar593 + auVar79 * auVar379;
  uVar688 = auVar3._0_8_;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar688 & 0xfffffffffffff;
  auVar2 = auVar75 * auVar375 + auVar592 + auVar76 * auVar376 + auVar77 * auVar377 +
           auVar80 * ZEXT816(0x1000003d10);
  uVar692 = auVar2._0_8_;
  uVar678 = uVar692 & 0xfffffffffffff;
  auVar594._8_8_ = 0;
  auVar594._0_8_ = (uVar692 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar677 & 0xfffffffffffff);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar688 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar594 = auVar81 * ZEXT816(0x1000003d10) + auVar594;
  uVar692 = auVar594._0_8_;
  uVar688 = uVar692 & 0xfffffffffffff;
  uVar677 = (uVar692 >> 0x34 | auVar594._8_8_ << 0xc) + (uVar690 & 0xffffffffffff);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = psVar681->n[0];
  auVar380._8_8_ = 0;
  auVar380._0_8_ = uVar688;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = (a->z).n[1];
  auVar381._8_8_ = 0;
  auVar381._0_8_ = uVar678;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = (a->z).n[2];
  auVar382._8_8_ = 0;
  auVar382._0_8_ = uVar676;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = (a->z).n[3];
  auVar383._8_8_ = 0;
  auVar383._0_8_ = uVar660;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = (a->z).n[4];
  auVar384._8_8_ = 0;
  auVar384._0_8_ = uVar677;
  uVar692 = SUB168(auVar86 * auVar384,0);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar692 & 0xfffffffffffff;
  auVar2 = auVar83 * auVar381 + auVar82 * auVar380 + auVar84 * auVar382 + auVar85 * auVar383 +
           auVar87 * ZEXT816(0x1000003d10);
  uVar666 = auVar2._0_8_;
  auVar595._8_8_ = 0;
  auVar595._0_8_ = uVar666 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = psVar681->n[0];
  auVar385._8_8_ = 0;
  auVar385._0_8_ = uVar677;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = (a->z).n[1];
  auVar386._8_8_ = 0;
  auVar386._0_8_ = uVar688;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = (a->z).n[2];
  auVar387._8_8_ = 0;
  auVar387._0_8_ = uVar678;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = (a->z).n[3];
  auVar388._8_8_ = 0;
  auVar388._0_8_ = uVar676;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = (a->z).n[4];
  auVar389._8_8_ = 0;
  auVar389._0_8_ = uVar660;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar692 >> 0x34 | SUB168(auVar86 * auVar384,8) << 0xc;
  auVar2 = auVar88 * auVar385 + auVar595 + auVar89 * auVar386 + auVar90 * auVar387 +
           auVar91 * auVar388 + auVar92 * auVar389 + auVar93 * ZEXT816(0x1000003d10);
  uVar692 = auVar2._0_8_;
  auVar596._8_8_ = 0;
  auVar596._0_8_ = uVar692 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = psVar681->n[0];
  auVar390._8_8_ = 0;
  auVar390._0_8_ = uVar660;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = (a->z).n[1];
  auVar391._8_8_ = 0;
  auVar391._0_8_ = uVar677;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = (a->z).n[2];
  auVar392._8_8_ = 0;
  auVar392._0_8_ = uVar688;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = (a->z).n[3];
  auVar393._8_8_ = 0;
  auVar393._0_8_ = uVar678;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = (a->z).n[4];
  auVar394._8_8_ = 0;
  auVar394._0_8_ = uVar676;
  auVar2 = auVar95 * auVar391 + auVar596 + auVar96 * auVar392 + auVar97 * auVar393 +
           auVar98 * auVar394;
  uVar667 = auVar2._0_8_;
  auVar598._8_8_ = 0;
  auVar598._0_8_ = uVar667 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar395._8_8_ = 0;
  auVar395._0_8_ = (uVar667 & 0xfffffffffffff) << 4 | (uVar692 & 0xfffffffffffff) >> 0x30;
  auVar2 = auVar94 * auVar390 + ZEXT816(0x1000003d1) * auVar395;
  uVar667 = auVar2._0_8_;
  local_a8 = uVar667 & 0xfffffffffffff;
  auVar597._8_8_ = 0;
  auVar597._0_8_ = uVar667 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = psVar681->n[0];
  auVar396._8_8_ = 0;
  auVar396._0_8_ = uVar676;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = (a->z).n[1];
  auVar397._8_8_ = 0;
  auVar397._0_8_ = uVar660;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = (a->z).n[2];
  auVar398._8_8_ = 0;
  auVar398._0_8_ = uVar677;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = (a->z).n[3];
  auVar399._8_8_ = 0;
  auVar399._0_8_ = uVar688;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = (a->z).n[4];
  auVar400._8_8_ = 0;
  auVar400._0_8_ = uVar678;
  auVar3 = auVar101 * auVar398 + auVar598 + auVar102 * auVar399 + auVar103 * auVar400;
  uVar667 = auVar3._0_8_;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar667 & 0xfffffffffffff;
  auVar2 = auVar99 * auVar396 + auVar597 + auVar100 * auVar397 + auVar104 * ZEXT816(0x1000003d10);
  uVar690 = auVar2._0_8_;
  auVar600._8_8_ = 0;
  auVar600._0_8_ = uVar667 >> 0x34 | auVar3._8_8_ << 0xc;
  local_a0 = uVar690 & 0xfffffffffffff;
  auVar599._8_8_ = 0;
  auVar599._0_8_ = uVar690 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = psVar681->n[0];
  auVar401._8_8_ = 0;
  auVar401._0_8_ = uVar678;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = (a->z).n[1];
  auVar402._8_8_ = 0;
  auVar402._0_8_ = uVar676;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = (a->z).n[2];
  auVar403._8_8_ = 0;
  auVar403._0_8_ = uVar660;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = (a->z).n[3];
  auVar404._8_8_ = 0;
  auVar404._0_8_ = uVar677;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = (a->z).n[4];
  auVar405._8_8_ = 0;
  auVar405._0_8_ = uVar688;
  auVar3 = auVar108 * auVar404 + auVar600 + auVar109 * auVar405;
  uVar678 = auVar3._0_8_;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar678 & 0xfffffffffffff;
  auVar2 = auVar105 * auVar401 + auVar599 + auVar106 * auVar402 + auVar107 * auVar403 +
           auVar110 * ZEXT816(0x1000003d10);
  uVar688 = auVar2._0_8_;
  local_98 = uVar688 & 0xfffffffffffff;
  auVar601._8_8_ = 0;
  auVar601._0_8_ = (uVar688 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar666 & 0xfffffffffffff);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar678 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar601 = auVar111 * ZEXT816(0x1000003d10) + auVar601;
  uVar678 = auVar601._0_8_;
  local_90 = uVar678 & 0xfffffffffffff;
  local_88 = (uVar678 >> 0x34 | auVar601._8_8_ << 0xc) + (uVar692 & 0xffffffffffff);
  uVar666 = uVar687 + local_d0;
  uVar667 = uVar672 + local_c8;
  uVar660 = uVar682 + local_c0;
  uVar676 = uVar686 + local_b8;
  uVar677 = uVar689 + local_b0;
  uVar691 = local_a8 + uVar673;
  uVar661 = local_a0 + uVar683;
  uVar662 = local_98 + uVar674;
  uVar663 = local_90 + uVar684;
  uVar664 = local_88 + lVar665;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar666 * 2;
  auVar406._8_8_ = 0;
  auVar406._0_8_ = uVar676;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar667 * 2;
  auVar407._8_8_ = 0;
  auVar407._0_8_ = uVar660;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar677;
  auVar408._8_8_ = 0;
  auVar408._0_8_ = uVar677;
  uVar688 = SUB168(auVar114 * auVar408,0);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar688 & 0xfffffffffffff;
  auVar2 = auVar113 * auVar407 + auVar112 * auVar406 + auVar115 * ZEXT816(0x1000003d10);
  uVar692 = auVar2._0_8_;
  auVar602._8_8_ = 0;
  auVar602._0_8_ = uVar692 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar678 = uVar677 * 2;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar666;
  auVar409._8_8_ = 0;
  auVar409._0_8_ = uVar678;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar667 * 2;
  auVar410._8_8_ = 0;
  auVar410._0_8_ = uVar676;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar660;
  auVar411._8_8_ = 0;
  auVar411._0_8_ = uVar660;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar688 >> 0x34 | SUB168(auVar114 * auVar408,8) << 0xc;
  auVar2 = auVar116 * auVar409 + auVar602 + auVar117 * auVar410 + auVar118 * auVar411 +
           auVar119 * ZEXT816(0x1000003d10);
  uVar679 = auVar2._0_8_;
  auVar603._8_8_ = 0;
  auVar603._0_8_ = uVar679 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar666;
  auVar412._8_8_ = 0;
  auVar412._0_8_ = uVar666;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar667;
  auVar413._8_8_ = 0;
  auVar413._0_8_ = uVar678;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar660 * 2;
  auVar414._8_8_ = 0;
  auVar414._0_8_ = uVar676;
  auVar2 = auVar121 * auVar413 + auVar603 + auVar122 * auVar414;
  uVar688 = auVar2._0_8_;
  auVar605._8_8_ = 0;
  auVar605._0_8_ = uVar688 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar415._8_8_ = 0;
  auVar415._0_8_ = (uVar688 & 0xfffffffffffff) << 4 | (uVar679 & 0xfffffffffffff) >> 0x30;
  auVar2 = auVar120 * auVar412 + ZEXT816(0x1000003d1) * auVar415;
  uVar693 = auVar2._0_8_;
  auVar604._8_8_ = 0;
  auVar604._0_8_ = uVar693 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar666 * 2;
  auVar416._8_8_ = 0;
  auVar416._0_8_ = uVar667;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar660;
  auVar417._8_8_ = 0;
  auVar417._0_8_ = uVar678;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar676;
  auVar418._8_8_ = 0;
  auVar418._0_8_ = uVar676;
  auVar3 = auVar124 * auVar417 + auVar605 + auVar125 * auVar418;
  uVar688 = auVar3._0_8_;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar688 & 0xfffffffffffff;
  auVar2 = auVar123 * auVar416 + auVar604 + auVar126 * ZEXT816(0x1000003d10);
  uVar694 = auVar2._0_8_;
  auVar607._8_8_ = 0;
  auVar607._0_8_ = uVar688 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar606._8_8_ = 0;
  auVar606._0_8_ = uVar694 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar666 * 2;
  auVar419._8_8_ = 0;
  auVar419._0_8_ = uVar660;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar667;
  auVar420._8_8_ = 0;
  auVar420._0_8_ = uVar667;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar676;
  auVar421._8_8_ = 0;
  auVar421._0_8_ = uVar678;
  auVar607 = auVar129 * auVar421 + auVar607;
  uVar678 = auVar607._0_8_;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar678 & 0xfffffffffffff;
  auVar2 = auVar127 * auVar419 + auVar606 + auVar128 * auVar420 + auVar130 * ZEXT816(0x1000003d10);
  uVar695 = auVar2._0_8_;
  auVar608._8_8_ = 0;
  auVar608._0_8_ = (uVar695 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar692 & 0xfffffffffffff);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar678 >> 0x34 | auVar607._8_8_ << 0xc;
  auVar608 = auVar131 * ZEXT816(0x1000003d10) + auVar608;
  uVar696 = auVar608._0_8_;
  uVar688 = 0x3ffffbfffff0bc - local_d0;
  uVar668 = 0x3ffffffffffffc - local_c8;
  uVar669 = 0x3ffffffffffffc - local_c0;
  uVar692 = 0x3ffffffffffffc - local_b8;
  uVar690 = 0x3fffffffffffc - local_b0;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar688;
  auVar422._8_8_ = 0;
  auVar422._0_8_ = uVar686;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar668;
  auVar423._8_8_ = 0;
  auVar423._0_8_ = uVar682;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar669;
  auVar424._8_8_ = 0;
  auVar424._0_8_ = uVar672;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar692;
  auVar425._8_8_ = 0;
  auVar425._0_8_ = uVar687;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar690;
  auVar426._8_8_ = 0;
  auVar426._0_8_ = uVar689;
  uVar678 = SUB168(auVar136 * auVar426,0);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar678 & 0xfffffffffffff;
  auVar2 = auVar133 * auVar423 + auVar132 * auVar422 + auVar134 * auVar424 + auVar135 * auVar425 +
           auVar137 * ZEXT816(0x1000003d10);
  uVar670 = auVar2._0_8_;
  auVar609._8_8_ = 0;
  auVar609._0_8_ = uVar670 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar688;
  auVar427._8_8_ = 0;
  auVar427._0_8_ = uVar689;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar668;
  auVar428._8_8_ = 0;
  auVar428._0_8_ = uVar686;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uVar669;
  auVar429._8_8_ = 0;
  auVar429._0_8_ = uVar682;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar692;
  auVar430._8_8_ = 0;
  auVar430._0_8_ = uVar672;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar690;
  auVar431._8_8_ = 0;
  auVar431._0_8_ = uVar687;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar678 >> 0x34 | SUB168(auVar136 * auVar426,8) << 0xc;
  auVar2 = auVar138 * auVar427 + auVar609 + auVar139 * auVar428 + auVar140 * auVar429 +
           auVar141 * auVar430 + auVar142 * auVar431 + auVar143 * ZEXT816(0x1000003d10);
  uVar678 = auVar2._0_8_;
  auVar610._8_8_ = 0;
  auVar610._0_8_ = uVar678 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar688;
  auVar432._8_8_ = 0;
  auVar432._0_8_ = uVar687;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar668;
  auVar433._8_8_ = 0;
  auVar433._0_8_ = uVar689;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar669;
  auVar434._8_8_ = 0;
  auVar434._0_8_ = uVar686;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar692;
  auVar435._8_8_ = 0;
  auVar435._0_8_ = uVar682;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar690;
  auVar436._8_8_ = 0;
  auVar436._0_8_ = uVar672;
  auVar2 = auVar145 * auVar433 + auVar610 + auVar146 * auVar434 + auVar147 * auVar435 +
           auVar148 * auVar436;
  uVar671 = auVar2._0_8_;
  auVar612._8_8_ = 0;
  auVar612._0_8_ = uVar671 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar437._8_8_ = 0;
  auVar437._0_8_ = (uVar671 & 0xfffffffffffff) << 4 | (uVar678 & 0xfffffffffffff) >> 0x30;
  auVar2 = auVar144 * auVar432 + ZEXT816(0x1000003d1) * auVar437;
  uVar697 = auVar2._0_8_;
  auVar611._8_8_ = 0;
  auVar611._0_8_ = uVar697 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar688;
  auVar438._8_8_ = 0;
  auVar438._0_8_ = uVar672;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar668;
  auVar439._8_8_ = 0;
  auVar439._0_8_ = uVar687;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar669;
  auVar440._8_8_ = 0;
  auVar440._0_8_ = uVar689;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar692;
  auVar441._8_8_ = 0;
  auVar441._0_8_ = uVar686;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar690;
  auVar442._8_8_ = 0;
  auVar442._0_8_ = uVar682;
  auVar3 = auVar151 * auVar440 + auVar612 + auVar152 * auVar441 + auVar153 * auVar442;
  uVar671 = auVar3._0_8_;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar671 & 0xfffffffffffff;
  auVar2 = auVar149 * auVar438 + auVar611 + auVar150 * auVar439 + auVar154 * ZEXT816(0x1000003d10);
  uVar698 = auVar2._0_8_;
  auVar614._8_8_ = 0;
  auVar614._0_8_ = uVar671 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar613._8_8_ = 0;
  auVar613._0_8_ = uVar698 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar688;
  auVar443._8_8_ = 0;
  auVar443._0_8_ = uVar682;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar668;
  auVar444._8_8_ = 0;
  auVar444._0_8_ = uVar672;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar669;
  auVar445._8_8_ = 0;
  auVar445._0_8_ = uVar687;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar692;
  auVar446._8_8_ = 0;
  auVar446._0_8_ = uVar689;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar690;
  auVar447._8_8_ = 0;
  auVar447._0_8_ = uVar686;
  auVar3 = auVar158 * auVar446 + auVar614 + auVar159 * auVar447;
  uVar671 = auVar3._0_8_;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar671 & 0xfffffffffffff;
  auVar2 = auVar155 * auVar443 + auVar613 + auVar156 * auVar444 + auVar157 * auVar445 +
           auVar160 * ZEXT816(0x1000003d10);
  uVar699 = auVar2._0_8_;
  auVar615._8_8_ = 0;
  auVar615._0_8_ = (uVar699 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar670 & 0xfffffffffffff);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar671 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar615 = auVar161 * ZEXT816(0x1000003d10) + auVar615;
  uVar670 = auVar615._0_8_;
  uVar671 = (uVar693 & 0xfffffffffffff) + (uVar697 & 0xfffffffffffff);
  uVar694 = (uVar694 & 0xfffffffffffff) + (uVar698 & 0xfffffffffffff);
  uVar693 = (uVar695 & 0xfffffffffffff) + (uVar699 & 0xfffffffffffff);
  uVar697 = (uVar696 & 0xfffffffffffff) + (uVar670 & 0xfffffffffffff);
  uVar695 = (uVar696 >> 0x34 | auVar608._8_8_ << 0xc) + (uVar679 & 0xffffffffffff) +
            (uVar670 >> 0x34 | auVar615._8_8_ << 0xc) + (uVar678 & 0xffffffffffff);
  local_f8.n[0] = uVar691;
  local_f8.n[1] = uVar661;
  local_f8.n[2] = uVar662;
  local_f8.n[3] = uVar663;
  local_f8.n[4] = uVar664;
  local_58.n[0] = uVar671;
  local_58.n[1] = uVar694;
  local_58.n[2] = uVar693;
  local_58.n[3] = uVar697;
  local_58.n[4] = uVar695;
  uVar658 = secp256k1_fe_normalizes_to_zero(&local_f8);
  uVar659 = secp256k1_fe_normalizes_to_zero(&local_58);
  uVar659 = uVar659 & uVar658;
  uVar678 = (ulong)(uVar659 ^ 1) - 1;
  uVar670 = -(ulong)(uVar659 ^ 1);
  uVar679 = uVar671 & uVar670 | uVar673 * 2 & uVar678;
  uVar704 = uVar694 & uVar670 | uVar683 * 2 & uVar678;
  uVar703 = uVar693 & uVar670 | uVar674 * 2 & uVar678;
  uVar706 = uVar697 & uVar670 | uVar684 * 2 & uVar678;
  uVar705 = uVar695 & uVar670 | lVar665 * 2 & uVar678;
  uVar701 = uVar691 & uVar670 | uVar688 + uVar687 & uVar678;
  uVar684 = uVar661 & uVar670 | uVar668 + uVar672 & uVar678;
  uVar683 = uVar662 & uVar670 | uVar669 + uVar682 & uVar678;
  uVar668 = uVar663 & uVar670 | uVar692 + uVar686 & uVar678;
  uVar673 = uVar670 & uVar664 | uVar690 + uVar689 & uVar678;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar701 * 2;
  auVar448._8_8_ = 0;
  auVar448._0_8_ = uVar668;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar684 * 2;
  auVar449._8_8_ = 0;
  auVar449._0_8_ = uVar683;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar673;
  auVar450._8_8_ = 0;
  auVar450._0_8_ = uVar673;
  uVar688 = SUB168(auVar164 * auVar450,0);
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uVar688 & 0xfffffffffffff;
  auVar2 = auVar163 * auVar449 + auVar162 * auVar448 + auVar165 * ZEXT816(0x1000003d10);
  uVar692 = auVar2._0_8_;
  auVar616._8_8_ = 0;
  auVar616._0_8_ = uVar692 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar678 = uVar673 * 2;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar701;
  auVar451._8_8_ = 0;
  auVar451._0_8_ = uVar678;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar684 * 2;
  auVar452._8_8_ = 0;
  auVar452._0_8_ = uVar668;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar683;
  auVar453._8_8_ = 0;
  auVar453._0_8_ = uVar683;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar688 >> 0x34 | SUB168(auVar164 * auVar450,8) << 0xc;
  auVar2 = auVar166 * auVar451 + auVar616 + auVar167 * auVar452 + auVar168 * auVar453 +
           auVar169 * ZEXT816(0x1000003d10);
  uVar688 = auVar2._0_8_;
  auVar617._8_8_ = 0;
  auVar617._0_8_ = uVar688 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uVar701;
  auVar454._8_8_ = 0;
  auVar454._0_8_ = uVar701;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar684;
  auVar455._8_8_ = 0;
  auVar455._0_8_ = uVar678;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar683 * 2;
  auVar456._8_8_ = 0;
  auVar456._0_8_ = uVar668;
  auVar2 = auVar171 * auVar455 + auVar617 + auVar172 * auVar456;
  uVar687 = auVar2._0_8_;
  auVar619._8_8_ = 0;
  auVar619._0_8_ = uVar687 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar457._8_8_ = 0;
  auVar457._0_8_ = (uVar687 & 0xfffffffffffff) << 4 | (uVar688 & 0xfffffffffffff) >> 0x30;
  auVar2 = auVar170 * auVar454 + ZEXT816(0x1000003d1) * auVar457;
  uVar690 = auVar2._0_8_;
  uVar687 = uVar690 & 0xfffffffffffff;
  auVar618._8_8_ = 0;
  auVar618._0_8_ = uVar690 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uVar701 * 2;
  auVar458._8_8_ = 0;
  auVar458._0_8_ = uVar684;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uVar683;
  auVar459._8_8_ = 0;
  auVar459._0_8_ = uVar678;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar668;
  auVar460._8_8_ = 0;
  auVar460._0_8_ = uVar668;
  auVar3 = auVar174 * auVar459 + auVar619 + auVar175 * auVar460;
  uVar690 = auVar3._0_8_;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = uVar690 & 0xfffffffffffff;
  auVar2 = auVar173 * auVar458 + auVar618 + auVar176 * ZEXT816(0x1000003d10);
  uVar669 = auVar2._0_8_;
  auVar621._8_8_ = 0;
  auVar621._0_8_ = uVar690 >> 0x34 | auVar3._8_8_ << 0xc;
  uVar690 = uVar669 & 0xfffffffffffff;
  auVar620._8_8_ = 0;
  auVar620._0_8_ = uVar669 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = uVar701 * 2;
  auVar461._8_8_ = 0;
  auVar461._0_8_ = uVar683;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uVar684;
  auVar462._8_8_ = 0;
  auVar462._0_8_ = uVar684;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = uVar668;
  auVar463._8_8_ = 0;
  auVar463._0_8_ = uVar678;
  auVar621 = auVar179 * auVar463 + auVar621;
  uVar678 = auVar621._0_8_;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uVar678 & 0xfffffffffffff;
  auVar2 = auVar177 * auVar461 + auVar620 + auVar178 * auVar462 + auVar180 * ZEXT816(0x1000003d10);
  uVar670 = auVar2._0_8_;
  uVar669 = uVar670 & 0xfffffffffffff;
  auVar622._8_8_ = 0;
  auVar622._0_8_ = (uVar670 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar692 & 0xfffffffffffff);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = uVar678 >> 0x34 | auVar621._8_8_ << 0xc;
  auVar622 = auVar181 * ZEXT816(0x1000003d10) + auVar622;
  uVar678 = auVar622._0_8_;
  uVar670 = uVar678 & 0xfffffffffffff;
  uVar678 = (uVar678 >> 0x34 | auVar622._8_8_ << 0xc) + (uVar688 & 0xffffffffffff);
  uVar666 = 0x5ffff9ffffe91a - uVar666;
  uVar667 = 0x5ffffffffffffa - uVar667;
  uVar660 = 0x5ffffffffffffa - uVar660;
  uVar676 = 0x5ffffffffffffa - uVar676;
  uVar677 = 0x5fffffffffffa - uVar677;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar687;
  auVar464._8_8_ = 0;
  auVar464._0_8_ = uVar676;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = uVar690;
  auVar465._8_8_ = 0;
  auVar465._0_8_ = uVar660;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar669;
  auVar466._8_8_ = 0;
  auVar466._0_8_ = uVar667;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar670;
  auVar467._8_8_ = 0;
  auVar467._0_8_ = uVar666;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar678;
  auVar468._8_8_ = 0;
  auVar468._0_8_ = uVar677;
  uVar688 = SUB168(auVar186 * auVar468,0);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = uVar688 & 0xfffffffffffff;
  auVar2 = auVar183 * auVar465 + auVar182 * auVar464 + auVar184 * auVar466 + auVar185 * auVar467 +
           auVar187 * ZEXT816(0x1000003d10);
  uVar671 = auVar2._0_8_;
  auVar623._8_8_ = 0;
  auVar623._0_8_ = uVar671 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar687;
  auVar469._8_8_ = 0;
  auVar469._0_8_ = uVar677;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = uVar690;
  auVar470._8_8_ = 0;
  auVar470._0_8_ = uVar676;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar669;
  auVar471._8_8_ = 0;
  auVar471._0_8_ = uVar660;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar670;
  auVar472._8_8_ = 0;
  auVar472._0_8_ = uVar667;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar678;
  auVar473._8_8_ = 0;
  auVar473._0_8_ = uVar666;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar688 >> 0x34 | SUB168(auVar186 * auVar468,8) << 0xc;
  auVar2 = auVar188 * auVar469 + auVar623 + auVar189 * auVar470 + auVar190 * auVar471 +
           auVar191 * auVar472 + auVar192 * auVar473 + auVar193 * ZEXT816(0x1000003d10);
  uVar672 = auVar2._0_8_;
  auVar624._8_8_ = 0;
  auVar624._0_8_ = uVar672 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar687;
  auVar474._8_8_ = 0;
  auVar474._0_8_ = uVar666;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar690;
  auVar475._8_8_ = 0;
  auVar475._0_8_ = uVar677;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar669;
  auVar476._8_8_ = 0;
  auVar476._0_8_ = uVar676;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar670;
  auVar477._8_8_ = 0;
  auVar477._0_8_ = uVar660;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar678;
  auVar478._8_8_ = 0;
  auVar478._0_8_ = uVar667;
  auVar2 = auVar195 * auVar475 + auVar624 + auVar196 * auVar476 + auVar197 * auVar477 +
           auVar198 * auVar478;
  uVar688 = auVar2._0_8_;
  auVar626._8_8_ = 0;
  auVar626._0_8_ = uVar688 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar479._8_8_ = 0;
  auVar479._0_8_ = (uVar688 & 0xfffffffffffff) << 4 | (uVar672 & 0xfffffffffffff) >> 0x30;
  auVar2 = auVar194 * auVar474 + ZEXT816(0x1000003d1) * auVar479;
  uVar692 = auVar2._0_8_;
  uVar688 = uVar692 & 0xfffffffffffff;
  auVar625._8_8_ = 0;
  auVar625._0_8_ = uVar692 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar687;
  auVar480._8_8_ = 0;
  auVar480._0_8_ = uVar667;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar690;
  auVar481._8_8_ = 0;
  auVar481._0_8_ = uVar666;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar669;
  auVar482._8_8_ = 0;
  auVar482._0_8_ = uVar677;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar670;
  auVar483._8_8_ = 0;
  auVar483._0_8_ = uVar676;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar678;
  auVar484._8_8_ = 0;
  auVar484._0_8_ = uVar660;
  auVar3 = auVar201 * auVar482 + auVar626 + auVar202 * auVar483 + auVar203 * auVar484;
  uVar692 = auVar3._0_8_;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar692 & 0xfffffffffffff;
  auVar2 = auVar199 * auVar480 + auVar625 + auVar200 * auVar481 + auVar204 * ZEXT816(0x1000003d10);
  uVar674 = auVar2._0_8_;
  auVar628._8_8_ = 0;
  auVar628._0_8_ = uVar692 >> 0x34 | auVar3._8_8_ << 0xc;
  uVar692 = uVar674 & 0xfffffffffffff;
  auVar627._8_8_ = 0;
  auVar627._0_8_ = uVar674 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar687;
  auVar485._8_8_ = 0;
  auVar485._0_8_ = uVar660;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar690;
  auVar486._8_8_ = 0;
  auVar486._0_8_ = uVar667;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar669;
  auVar487._8_8_ = 0;
  auVar487._0_8_ = uVar666;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar670;
  auVar488._8_8_ = 0;
  auVar488._0_8_ = uVar677;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = uVar678;
  auVar489._8_8_ = 0;
  auVar489._0_8_ = uVar676;
  auVar3 = auVar208 * auVar488 + auVar628 + auVar209 * auVar489;
  uVar667 = auVar3._0_8_;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar667 & 0xfffffffffffff;
  auVar2 = auVar205 * auVar485 + auVar627 + auVar206 * auVar486 + auVar207 * auVar487 +
           auVar210 * ZEXT816(0x1000003d10);
  uVar660 = auVar2._0_8_;
  uVar666 = uVar660 & 0xfffffffffffff;
  auVar629._8_8_ = 0;
  auVar629._0_8_ = (uVar660 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar671 & 0xfffffffffffff);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar667 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar629 = auVar211 * ZEXT816(0x1000003d10) + auVar629;
  uVar660 = auVar629._0_8_;
  uVar667 = uVar660 & 0xfffffffffffff;
  lVar665 = (uVar660 >> 0x34 | auVar629._8_8_ << 0xc) + (uVar672 & 0xffffffffffff);
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar687 * 2;
  auVar490._8_8_ = 0;
  auVar490._0_8_ = uVar670;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar690 * 2;
  auVar491._8_8_ = 0;
  auVar491._0_8_ = uVar669;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar678;
  auVar492._8_8_ = 0;
  auVar492._0_8_ = uVar678;
  uVar660 = SUB168(auVar214 * auVar492,0);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar660 & 0xfffffffffffff;
  auVar2 = auVar213 * auVar491 + auVar212 * auVar490 + auVar215 * ZEXT816(0x1000003d10);
  uVar676 = auVar2._0_8_;
  auVar630._8_8_ = 0;
  auVar630._0_8_ = uVar676 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar678 = uVar678 * 2;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar687;
  auVar493._8_8_ = 0;
  auVar493._0_8_ = uVar678;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar690 * 2;
  auVar494._8_8_ = 0;
  auVar494._0_8_ = uVar670;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar669;
  auVar495._8_8_ = 0;
  auVar495._0_8_ = uVar669;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar660 >> 0x34 | SUB168(auVar214 * auVar492,8) << 0xc;
  auVar2 = auVar216 * auVar493 + auVar630 + auVar217 * auVar494 + auVar218 * auVar495 +
           auVar219 * ZEXT816(0x1000003d10);
  uVar672 = auVar2._0_8_;
  auVar631._8_8_ = 0;
  auVar631._0_8_ = uVar672 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar687;
  auVar496._8_8_ = 0;
  auVar496._0_8_ = uVar687;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar690;
  auVar497._8_8_ = 0;
  auVar497._0_8_ = uVar678;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar669 * 2;
  auVar498._8_8_ = 0;
  auVar498._0_8_ = uVar670;
  auVar2 = auVar221 * auVar497 + auVar631 + auVar222 * auVar498;
  uVar660 = auVar2._0_8_;
  auVar633._8_8_ = 0;
  auVar633._0_8_ = uVar660 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar499._8_8_ = 0;
  auVar499._0_8_ = (uVar660 & 0xfffffffffffff) << 4 | (uVar672 & 0xfffffffffffff) >> 0x30;
  auVar2 = auVar220 * auVar496 + ZEXT816(0x1000003d1) * auVar499;
  uVar686 = auVar2._0_8_;
  auVar632._8_8_ = 0;
  auVar632._0_8_ = uVar686 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar687 * 2;
  auVar500._8_8_ = 0;
  auVar500._0_8_ = uVar690;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar669;
  auVar501._8_8_ = 0;
  auVar501._0_8_ = uVar678;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = uVar670;
  auVar502._8_8_ = 0;
  auVar502._0_8_ = uVar670;
  auVar3 = auVar224 * auVar501 + auVar633 + auVar225 * auVar502;
  uVar660 = auVar3._0_8_;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar660 & 0xfffffffffffff;
  auVar2 = auVar223 * auVar500 + auVar632 + auVar226 * ZEXT816(0x1000003d10);
  uVar689 = auVar2._0_8_;
  auVar635._8_8_ = 0;
  auVar635._0_8_ = uVar660 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar634._8_8_ = 0;
  auVar634._0_8_ = uVar689 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uVar687 * 2;
  auVar503._8_8_ = 0;
  auVar503._0_8_ = uVar669;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = uVar690;
  auVar504._8_8_ = 0;
  auVar504._0_8_ = uVar690;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar670;
  auVar505._8_8_ = 0;
  auVar505._0_8_ = uVar678;
  auVar635 = auVar229 * auVar505 + auVar635;
  uVar678 = auVar635._0_8_;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar678 & 0xfffffffffffff;
  auVar2 = auVar227 * auVar503 + auVar634 + auVar228 * auVar504 + auVar230 * ZEXT816(0x1000003d10);
  uVar693 = auVar2._0_8_;
  auVar636._8_8_ = 0;
  auVar636._0_8_ = (uVar693 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar676 & 0xfffffffffffff);
  auVar231._8_8_ = 0;
  auVar231._0_8_ = uVar678 >> 0x34 | auVar635._8_8_ << 0xc;
  auVar636 = auVar231 * ZEXT816(0x1000003d10) + auVar636;
  uVar694 = auVar636._0_8_;
  uVar678 = (ulong)uVar659 - 1;
  uVar682 = -(ulong)uVar659;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar679 * 2;
  auVar506._8_8_ = 0;
  auVar506._0_8_ = uVar706;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uVar704 * 2;
  auVar507._8_8_ = 0;
  auVar507._0_8_ = uVar703;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = uVar705;
  auVar508._8_8_ = 0;
  auVar508._0_8_ = uVar705;
  uVar676 = SUB168(auVar234 * auVar508,0);
  auVar235._8_8_ = 0;
  auVar235._0_8_ = uVar676 & 0xfffffffffffff;
  auVar2 = auVar233 * auVar507 + auVar232 * auVar506 + auVar235 * ZEXT816(0x1000003d10);
  uVar677 = auVar2._0_8_;
  auVar637._8_8_ = 0;
  auVar637._0_8_ = uVar677 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar660 = uVar705 * 2;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar679;
  auVar509._8_8_ = 0;
  auVar509._0_8_ = uVar660;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = uVar704 * 2;
  auVar510._8_8_ = 0;
  auVar510._0_8_ = uVar706;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = uVar703;
  auVar511._8_8_ = 0;
  auVar511._0_8_ = uVar703;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = uVar676 >> 0x34 | SUB168(auVar234 * auVar508,8) << 0xc;
  auVar2 = auVar236 * auVar509 + auVar637 + auVar237 * auVar510 + auVar238 * auVar511 +
           auVar239 * ZEXT816(0x1000003d10);
  uVar674 = auVar2._0_8_;
  auVar638._8_8_ = 0;
  auVar638._0_8_ = uVar674 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = uVar679;
  auVar512._8_8_ = 0;
  auVar512._0_8_ = uVar679;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = uVar704;
  auVar513._8_8_ = 0;
  auVar513._0_8_ = uVar660;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = uVar703 * 2;
  auVar514._8_8_ = 0;
  auVar514._0_8_ = uVar706;
  auVar2 = auVar241 * auVar513 + auVar638 + auVar242 * auVar514;
  uVar676 = auVar2._0_8_;
  auVar640._8_8_ = 0;
  auVar640._0_8_ = uVar676 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar515._8_8_ = 0;
  auVar515._0_8_ = (uVar676 & 0xfffffffffffff) << 4 | (uVar674 & 0xfffffffffffff) >> 0x30;
  auVar2 = auVar240 * auVar512 + ZEXT816(0x1000003d1) * auVar515;
  uVar695 = auVar2._0_8_;
  auVar639._8_8_ = 0;
  auVar639._0_8_ = uVar695 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = uVar679 * 2;
  auVar516._8_8_ = 0;
  auVar516._0_8_ = uVar704;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = uVar703;
  auVar517._8_8_ = 0;
  auVar517._0_8_ = uVar660;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = uVar706;
  auVar518._8_8_ = 0;
  auVar518._0_8_ = uVar706;
  auVar3 = auVar244 * auVar517 + auVar640 + auVar245 * auVar518;
  uVar676 = auVar3._0_8_;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = uVar676 & 0xfffffffffffff;
  auVar2 = auVar243 * auVar516 + auVar639 + auVar246 * ZEXT816(0x1000003d10);
  uVar696 = auVar2._0_8_;
  auVar642._8_8_ = 0;
  auVar642._0_8_ = uVar676 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar641._8_8_ = 0;
  auVar641._0_8_ = uVar696 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = uVar679 * 2;
  auVar519._8_8_ = 0;
  auVar519._0_8_ = uVar703;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = uVar704;
  auVar520._8_8_ = 0;
  auVar520._0_8_ = uVar704;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = uVar706;
  auVar521._8_8_ = 0;
  auVar521._0_8_ = uVar660;
  auVar642 = auVar249 * auVar521 + auVar642;
  uVar660 = auVar642._0_8_;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = uVar660 & 0xfffffffffffff;
  auVar2 = auVar247 * auVar519 + auVar641 + auVar248 * auVar520 + auVar250 * ZEXT816(0x1000003d10);
  uVar697 = auVar2._0_8_;
  auVar643._8_8_ = 0;
  auVar643._0_8_ = (uVar697 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar677 & 0xfffffffffffff);
  auVar251._8_8_ = 0;
  auVar251._0_8_ = uVar660 >> 0x34 | auVar642._8_8_ << 0xc;
  auVar643 = auVar251 * ZEXT816(0x1000003d10) + auVar643;
  uVar698 = auVar643._0_8_;
  uVar660 = psVar681->n[0];
  uVar676 = (a->z).n[1];
  uVar677 = (a->z).n[2];
  uVar687 = (a->z).n[3];
  uVar690 = (a->z).n[4];
  auVar252._8_8_ = 0;
  auVar252._0_8_ = uVar701;
  auVar522._8_8_ = 0;
  auVar522._0_8_ = uVar687;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = uVar684;
  auVar523._8_8_ = 0;
  auVar523._0_8_ = uVar677;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = uVar683;
  auVar524._8_8_ = 0;
  auVar524._0_8_ = uVar676;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = uVar668;
  auVar525._8_8_ = 0;
  auVar525._0_8_ = uVar660;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = uVar673;
  auVar526._8_8_ = 0;
  auVar526._0_8_ = uVar690;
  uVar669 = SUB168(auVar256 * auVar526,0);
  auVar257._8_8_ = 0;
  auVar257._0_8_ = uVar669 & 0xfffffffffffff;
  auVar2 = auVar253 * auVar523 + auVar252 * auVar522 + auVar254 * auVar524 + auVar255 * auVar525 +
           auVar257 * ZEXT816(0x1000003d10);
  uVar670 = auVar2._0_8_;
  auVar644._8_8_ = 0;
  auVar644._0_8_ = uVar670 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = uVar701;
  auVar527._8_8_ = 0;
  auVar527._0_8_ = uVar690;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = uVar684;
  auVar528._8_8_ = 0;
  auVar528._0_8_ = uVar687;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = uVar683;
  auVar529._8_8_ = 0;
  auVar529._0_8_ = uVar677;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = uVar668;
  auVar530._8_8_ = 0;
  auVar530._0_8_ = uVar676;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = uVar673;
  auVar531._8_8_ = 0;
  auVar531._0_8_ = uVar660;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = uVar669 >> 0x34 | SUB168(auVar256 * auVar526,8) << 0xc;
  auVar2 = auVar258 * auVar527 + auVar644 + auVar259 * auVar528 + auVar260 * auVar529 +
           auVar261 * auVar530 + auVar262 * auVar531 + auVar263 * ZEXT816(0x1000003d10);
  uVar669 = auVar2._0_8_;
  auVar645._8_8_ = 0;
  auVar645._0_8_ = uVar669 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = uVar701;
  auVar532._8_8_ = 0;
  auVar532._0_8_ = uVar660;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = uVar684;
  auVar533._8_8_ = 0;
  auVar533._0_8_ = uVar690;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = uVar683;
  auVar534._8_8_ = 0;
  auVar534._0_8_ = uVar687;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = uVar668;
  auVar535._8_8_ = 0;
  auVar535._0_8_ = uVar677;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = uVar673;
  auVar536._8_8_ = 0;
  auVar536._0_8_ = uVar676;
  auVar2 = auVar265 * auVar533 + auVar645 + auVar266 * auVar534 + auVar267 * auVar535 +
           auVar268 * auVar536;
  uVar671 = auVar2._0_8_;
  auVar647._8_8_ = 0;
  auVar647._0_8_ = uVar671 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar537._8_8_ = 0;
  auVar537._0_8_ = (uVar671 & 0xfffffffffffff) << 4 | (uVar669 & 0xfffffffffffff) >> 0x30;
  auVar2 = auVar264 * auVar532 + ZEXT816(0x1000003d1) * auVar537;
  uVar671 = auVar2._0_8_;
  (r->z).n[0] = uVar671 & 0xfffffffffffff;
  auVar646._8_8_ = 0;
  auVar646._0_8_ = uVar671 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = uVar701;
  auVar538._8_8_ = 0;
  auVar538._0_8_ = uVar676;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = uVar684;
  auVar539._8_8_ = 0;
  auVar539._0_8_ = uVar660;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = uVar683;
  auVar540._8_8_ = 0;
  auVar540._0_8_ = uVar690;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = uVar668;
  auVar541._8_8_ = 0;
  auVar541._0_8_ = uVar687;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = uVar673;
  auVar542._8_8_ = 0;
  auVar542._0_8_ = uVar677;
  auVar3 = auVar271 * auVar540 + auVar647 + auVar272 * auVar541 + auVar273 * auVar542;
  uVar671 = auVar3._0_8_;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = uVar671 & 0xfffffffffffff;
  auVar2 = auVar269 * auVar538 + auVar646 + auVar270 * auVar539 + auVar274 * ZEXT816(0x1000003d10);
  uVar699 = auVar2._0_8_;
  auVar649._8_8_ = 0;
  auVar649._0_8_ = uVar671 >> 0x34 | auVar3._8_8_ << 0xc;
  (r->z).n[1] = uVar699 & 0xfffffffffffff;
  auVar648._8_8_ = 0;
  auVar648._0_8_ = uVar699 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = uVar701;
  auVar543._8_8_ = 0;
  auVar543._0_8_ = uVar677;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = uVar684;
  auVar544._8_8_ = 0;
  auVar544._0_8_ = uVar676;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = uVar683;
  auVar545._8_8_ = 0;
  auVar545._0_8_ = uVar660;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = uVar668;
  auVar546._8_8_ = 0;
  auVar546._0_8_ = uVar690;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = uVar673;
  auVar547._8_8_ = 0;
  auVar547._0_8_ = uVar687;
  auVar3 = auVar278 * auVar546 + auVar649 + auVar279 * auVar547;
  uVar660 = auVar3._0_8_;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = uVar660 & 0xfffffffffffff;
  auVar2 = auVar275 * auVar543 + auVar648 + auVar276 * auVar544 + auVar277 * auVar545 +
           auVar280 * ZEXT816(0x1000003d10);
  uVar676 = auVar2._0_8_;
  (r->z).n[2] = uVar676 & 0xfffffffffffff;
  auVar650._8_8_ = 0;
  auVar650._0_8_ = (uVar676 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar670 & 0xfffffffffffff);
  auVar281._8_8_ = 0;
  auVar281._0_8_ = uVar660 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar650 = auVar281 * ZEXT816(0x1000003d10) + auVar650;
  uVar660 = auVar650._0_8_;
  (r->z).n[3] = uVar660 & 0xfffffffffffff;
  (r->z).n[4] = (uVar660 >> 0x34 | auVar650._8_8_ << 0xc) + (uVar669 & 0xffffffffffff);
  uVar659 = secp256k1_fe_normalizes_to_zero(&r->z);
  uVar658 = a->infinity;
  uVar675 = (uVar695 & 0xfffffffffffff) + uVar688;
  uVar685 = (uVar696 & 0xfffffffffffff) + uVar692;
  uVar700 = (uVar697 & 0xfffffffffffff) + uVar666;
  uVar702 = (uVar698 & 0xfffffffffffff) + uVar667;
  uVar680 = (uVar698 >> 0x34 | auVar643._8_8_ << 0xc) + (uVar674 & 0xffffffffffff) + lVar665;
  (r->x).n[4] = uVar680;
  (r->x).n[0] = uVar675;
  (r->x).n[1] = uVar685;
  (r->x).n[2] = uVar700;
  (r->x).n[3] = uVar702;
  uVar688 = uVar688 + uVar675 * 2;
  uVar692 = uVar692 + uVar685 * 2;
  uVar666 = uVar666 + uVar700 * 2;
  uVar667 = uVar667 + uVar702 * 2;
  uVar660 = lVar665 + uVar680 * 2;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = uVar679;
  auVar548._8_8_ = 0;
  auVar548._0_8_ = uVar667;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = uVar704;
  auVar549._8_8_ = 0;
  auVar549._0_8_ = uVar666;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = uVar703;
  auVar550._8_8_ = 0;
  auVar550._0_8_ = uVar692;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = uVar706;
  auVar551._8_8_ = 0;
  auVar551._0_8_ = uVar688;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = uVar705;
  auVar552._8_8_ = 0;
  auVar552._0_8_ = uVar660;
  uVar676 = SUB168(auVar286 * auVar552,0);
  auVar287._8_8_ = 0;
  auVar287._0_8_ = uVar676 & 0xfffffffffffff;
  auVar2 = auVar283 * auVar549 + auVar282 * auVar548 + auVar284 * auVar550 + auVar285 * auVar551 +
           auVar287 * ZEXT816(0x1000003d10);
  uVar677 = auVar2._0_8_;
  auVar651._8_8_ = 0;
  auVar651._0_8_ = uVar677 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = uVar679;
  auVar553._8_8_ = 0;
  auVar553._0_8_ = uVar660;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = uVar704;
  auVar554._8_8_ = 0;
  auVar554._0_8_ = uVar667;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = uVar703;
  auVar555._8_8_ = 0;
  auVar555._0_8_ = uVar666;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uVar706;
  auVar556._8_8_ = 0;
  auVar556._0_8_ = uVar692;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = uVar705;
  auVar557._8_8_ = 0;
  auVar557._0_8_ = uVar688;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = uVar676 >> 0x34 | SUB168(auVar286 * auVar552,8) << 0xc;
  auVar2 = auVar288 * auVar553 + auVar651 + auVar289 * auVar554 + auVar290 * auVar555 +
           auVar291 * auVar556 + auVar292 * auVar557 + auVar293 * ZEXT816(0x1000003d10);
  uVar676 = auVar2._0_8_;
  auVar652._8_8_ = 0;
  auVar652._0_8_ = uVar676 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uVar679;
  auVar558._8_8_ = 0;
  auVar558._0_8_ = uVar688;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uVar704;
  auVar559._8_8_ = 0;
  auVar559._0_8_ = uVar660;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = uVar703;
  auVar560._8_8_ = 0;
  auVar560._0_8_ = uVar667;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = uVar706;
  auVar561._8_8_ = 0;
  auVar561._0_8_ = uVar666;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = uVar705;
  auVar562._8_8_ = 0;
  auVar562._0_8_ = uVar692;
  auVar2 = auVar295 * auVar559 + auVar652 + auVar296 * auVar560 + auVar297 * auVar561 +
           auVar298 * auVar562;
  uVar687 = auVar2._0_8_;
  auVar654._8_8_ = 0;
  auVar654._0_8_ = uVar687 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar563._8_8_ = 0;
  auVar563._0_8_ = (uVar687 & 0xfffffffffffff) << 4 | (uVar676 & 0xfffffffffffff) >> 0x30;
  auVar2 = auVar294 * auVar558 + ZEXT816(0x1000003d1) * auVar563;
  uVar690 = auVar2._0_8_;
  auVar653._8_8_ = 0;
  auVar653._0_8_ = uVar690 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = uVar679;
  auVar564._8_8_ = 0;
  auVar564._0_8_ = uVar692;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = uVar704;
  auVar565._8_8_ = 0;
  auVar565._0_8_ = uVar688;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = uVar703;
  auVar566._8_8_ = 0;
  auVar566._0_8_ = uVar660;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = uVar706;
  auVar567._8_8_ = 0;
  auVar567._0_8_ = uVar667;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = uVar705;
  auVar568._8_8_ = 0;
  auVar568._0_8_ = uVar666;
  auVar3 = auVar301 * auVar566 + auVar654 + auVar302 * auVar567 + auVar303 * auVar568;
  uVar687 = auVar3._0_8_;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = uVar687 & 0xfffffffffffff;
  auVar2 = auVar299 * auVar564 + auVar653 + auVar300 * auVar565 + auVar304 * ZEXT816(0x1000003d10);
  uVar668 = auVar2._0_8_;
  auVar656._8_8_ = 0;
  auVar656._0_8_ = uVar687 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar655._8_8_ = 0;
  auVar655._0_8_ = uVar668 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = uVar679;
  auVar569._8_8_ = 0;
  auVar569._0_8_ = uVar666;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = uVar704;
  auVar570._8_8_ = 0;
  auVar570._0_8_ = uVar692;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = uVar703;
  auVar571._8_8_ = 0;
  auVar571._0_8_ = uVar688;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = uVar706;
  auVar572._8_8_ = 0;
  auVar572._0_8_ = uVar660;
  auVar309._8_8_ = 0;
  auVar309._0_8_ = uVar705;
  auVar573._8_8_ = 0;
  auVar573._0_8_ = uVar667;
  auVar3 = auVar308 * auVar572 + auVar656 + auVar309 * auVar573;
  uVar688 = auVar3._0_8_;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = uVar688 & 0xfffffffffffff;
  auVar2 = auVar305 * auVar569 + auVar655 + auVar306 * auVar570 + auVar307 * auVar571 +
           auVar310 * ZEXT816(0x1000003d10);
  uVar692 = auVar2._0_8_;
  auVar657._8_8_ = 0;
  auVar657._0_8_ = (uVar692 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar677 & 0xfffffffffffff);
  auVar311._8_8_ = 0;
  auVar311._0_8_ = uVar688 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar657 = auVar311 * ZEXT816(0x1000003d10) + auVar657;
  uVar660 = auVar657._0_8_;
  lVar665 = 0x7ffff7ffffe178 -
            ((uVar690 & 0xfffffffffffff) + (uVar691 & uVar682 | uVar686 & 0xfffffffffffff & uVar678)
            );
  uVar688 = -(ulong)((uint)lVar665 & 1);
  uVar666 = uVar688 >> 0xc;
  uVar677 = (0x7ffffffffffff8 -
            ((uVar668 & 0xfffffffffffff) + (uVar661 & uVar682 | uVar689 & 0xfffffffffffff & uVar678)
            )) + uVar666;
  uVar692 = (0x7ffffffffffff8 -
            ((uVar692 & 0xfffffffffffff) + (uVar662 & uVar682 | uVar693 & 0xfffffffffffff & uVar678)
            )) + uVar666;
  uVar667 = uVar666 + (0x7ffffffffffff8 -
                      ((uVar660 & 0xfffffffffffff) +
                      (uVar663 & uVar682 | uVar694 & 0xfffffffffffff & uVar678)));
  uVar688 = ((uVar688 >> 0x10) -
            ((uVar660 >> 0x34 | auVar657._8_8_ << 0xc) + (uVar676 & 0xffffffffffff) +
            (uVar682 & uVar664 |
            uVar678 & (uVar694 >> 0x34 | auVar636._8_8_ << 0xc) + (uVar672 & 0xffffffffffff)))) +
            0x7fffffffffff8;
  uVar666 = ((ulong)((uint)uVar677 & 1) << 0x33) + ((uVar666 & 0xffffefffffc2f) + lVar665 >> 1);
  (r->y).n[0] = uVar666;
  uVar660 = ((ulong)((uint)uVar692 & 1) << 0x33) + (uVar677 >> 1);
  (r->y).n[1] = uVar660;
  uVar676 = ((ulong)((uint)uVar667 & 1) << 0x33) + (uVar692 >> 1);
  (r->y).n[2] = uVar676;
  uVar667 = ((ulong)((uint)uVar688 & 1) << 0x33) + (uVar667 >> 1);
  (r->y).n[3] = uVar667;
  uVar688 = uVar688 >> 1;
  (r->y).n[4] = uVar688;
  uVar678 = (long)a->infinity - 1;
  uVar692 = -(long)a->infinity;
  (r->x).n[0] = (b->x).n[0] & uVar692 | (r->x).n[0] & uVar678;
  (r->x).n[1] = (b->x).n[1] & uVar692 | (r->x).n[1] & uVar678;
  (r->x).n[2] = (b->x).n[2] & uVar692 | (r->x).n[2] & uVar678;
  (r->x).n[3] = (b->x).n[3] & uVar692 | (r->x).n[3] & uVar678;
  (r->x).n[4] = (b->x).n[4] & uVar692 | (r->x).n[4] & uVar678;
  (r->y).n[0] = (b->y).n[0] & uVar692 | uVar666 & uVar678;
  (r->y).n[1] = (b->y).n[1] & uVar692 | uVar660 & uVar678;
  (r->y).n[2] = (b->y).n[2] & uVar692 | uVar676 & uVar678;
  (r->y).n[3] = (b->y).n[3] & uVar692 | uVar667 & uVar678;
  (r->y).n[4] = (b->y).n[4] & uVar692 | uVar688 & uVar678;
  (r->z).n[0] = (ulong)((uint)uVar692 & 1) | (r->z).n[0] & uVar678;
  puVar1 = (r->z).n + 1;
  *puVar1 = *puVar1 & uVar678;
  puVar1 = (r->z).n + 2;
  *puVar1 = *puVar1 & uVar678;
  puVar1 = (r->z).n + 3;
  *puVar1 = *puVar1 & uVar678;
  puVar1 = (r->z).n + 4;
  *puVar1 = *puVar1 & uVar678;
  r->infinity = ~uVar658 & uVar659;
  return;
}

Assistant:

static void secp256k1_gej_add_ge(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b) {
    /* Operations: 7 mul, 5 sqr, 24 add/cmov/half/mul_int/negate/normalize_weak/normalizes_to_zero */
    secp256k1_fe zz, u1, u2, s1, s2, t, tt, m, n, q, rr;
    secp256k1_fe m_alt, rr_alt;
    int infinity, degenerate;
    VERIFY_CHECK(!b->infinity);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);

    /** In:
     *    Eric Brier and Marc Joye, Weierstrass Elliptic Curves and Side-Channel Attacks.
     *    In D. Naccache and P. Paillier, Eds., Public Key Cryptography, vol. 2274 of Lecture Notes in Computer Science, pages 335-345. Springer-Verlag, 2002.
     *  we find as solution for a unified addition/doubling formula:
     *    lambda = ((x1 + x2)^2 - x1 * x2 + a) / (y1 + y2), with a = 0 for secp256k1's curve equation.
     *    x3 = lambda^2 - (x1 + x2)
     *    2*y3 = lambda * (x1 + x2 - 2 * x3) - (y1 + y2).
     *
     *  Substituting x_i = Xi / Zi^2 and yi = Yi / Zi^3, for i=1,2,3, gives:
     *    U1 = X1*Z2^2, U2 = X2*Z1^2
     *    S1 = Y1*Z2^3, S2 = Y2*Z1^3
     *    Z = Z1*Z2
     *    T = U1+U2
     *    M = S1+S2
     *    Q = -T*M^2
     *    R = T^2-U1*U2
     *    X3 = R^2+Q
     *    Y3 = -(R*(2*X3+Q)+M^4)/2
     *    Z3 = M*Z
     *  (Note that the paper uses xi = Xi / Zi and yi = Yi / Zi instead.)
     *
     *  This formula has the benefit of being the same for both addition
     *  of distinct points and doubling. However, it breaks down in the
     *  case that either point is infinity, or that y1 = -y2. We handle
     *  these cases in the following ways:
     *
     *    - If b is infinity we simply bail by means of a VERIFY_CHECK.
     *
     *    - If a is infinity, we detect this, and at the end of the
     *      computation replace the result (which will be meaningless,
     *      but we compute to be constant-time) with b.x : b.y : 1.
     *
     *    - If a = -b, we have y1 = -y2, which is a degenerate case.
     *      But here the answer is infinity, so we simply set the
     *      infinity flag of the result, overriding the computed values
     *      without even needing to cmov.
     *
     *    - If y1 = -y2 but x1 != x2, which does occur thanks to certain
     *      properties of our curve (specifically, 1 has nontrivial cube
     *      roots in our field, and the curve equation has no x coefficient)
     *      then the answer is not infinity but also not given by the above
     *      equation. In this case, we cmov in place an alternate expression
     *      for lambda. Specifically (y1 - y2)/(x1 - x2). Where both these
     *      expressions for lambda are defined, they are equal, and can be
     *      obtained from each other by multiplication by (y1 + y2)/(y1 + y2)
     *      then substitution of x^3 + 7 for y^2 (using the curve equation).
     *      For all pairs of nonzero points (a, b) at least one is defined,
     *      so this covers everything.
     */

    secp256k1_fe_sqr(&zz, &a->z);                       /* z = Z1^2 */
    u1 = a->x; secp256k1_fe_normalize_weak(&u1);        /* u1 = U1 = X1*Z2^2 (1) */
    secp256k1_fe_mul(&u2, &b->x, &zz);                  /* u2 = U2 = X2*Z1^2 (1) */
    s1 = a->y; secp256k1_fe_normalize_weak(&s1);        /* s1 = S1 = Y1*Z2^3 (1) */
    secp256k1_fe_mul(&s2, &b->y, &zz);                  /* s2 = Y2*Z1^2 (1) */
    secp256k1_fe_mul(&s2, &s2, &a->z);                  /* s2 = S2 = Y2*Z1^3 (1) */
    t = u1; secp256k1_fe_add(&t, &u2);                  /* t = T = U1+U2 (2) */
    m = s1; secp256k1_fe_add(&m, &s2);                  /* m = M = S1+S2 (2) */
    secp256k1_fe_sqr(&rr, &t);                          /* rr = T^2 (1) */
    secp256k1_fe_negate(&m_alt, &u2, 1);                /* Malt = -X2*Z1^2 */
    secp256k1_fe_mul(&tt, &u1, &m_alt);                 /* tt = -U1*U2 (2) */
    secp256k1_fe_add(&rr, &tt);                         /* rr = R = T^2-U1*U2 (3) */
    /** If lambda = R/M = 0/0 we have a problem (except in the "trivial"
     *  case that Z = z1z2 = 0, and this is special-cased later on). */
    degenerate = secp256k1_fe_normalizes_to_zero(&m) &
                 secp256k1_fe_normalizes_to_zero(&rr);
    /* This only occurs when y1 == -y2 and x1^3 == x2^3, but x1 != x2.
     * This means either x1 == beta*x2 or beta*x1 == x2, where beta is
     * a nontrivial cube root of one. In either case, an alternate
     * non-indeterminate expression for lambda is (y1 - y2)/(x1 - x2),
     * so we set R/M equal to this. */
    rr_alt = s1;
    secp256k1_fe_mul_int(&rr_alt, 2);       /* rr = Y1*Z2^3 - Y2*Z1^3 (2) */
    secp256k1_fe_add(&m_alt, &u1);          /* Malt = X1*Z2^2 - X2*Z1^2 */

    secp256k1_fe_cmov(&rr_alt, &rr, !degenerate);
    secp256k1_fe_cmov(&m_alt, &m, !degenerate);
    /* Now Ralt / Malt = lambda and is guaranteed not to be 0/0.
     * From here on out Ralt and Malt represent the numerator
     * and denominator of lambda; R and M represent the explicit
     * expressions x1^2 + x2^2 + x1x2 and y1 + y2. */
    secp256k1_fe_sqr(&n, &m_alt);                       /* n = Malt^2 (1) */
    secp256k1_fe_negate(&q, &t, 2);                     /* q = -T (3) */
    secp256k1_fe_mul(&q, &q, &n);                       /* q = Q = -T*Malt^2 (1) */
    /* These two lines use the observation that either M == Malt or M == 0,
     * so M^3 * Malt is either Malt^4 (which is computed by squaring), or
     * zero (which is "computed" by cmov). So the cost is one squaring
     * versus two multiplications. */
    secp256k1_fe_sqr(&n, &n);
    secp256k1_fe_cmov(&n, &m, degenerate);              /* n = M^3 * Malt (2) */
    secp256k1_fe_sqr(&t, &rr_alt);                      /* t = Ralt^2 (1) */
    secp256k1_fe_mul(&r->z, &a->z, &m_alt);             /* r->z = Z3 = Malt*Z (1) */
    infinity = secp256k1_fe_normalizes_to_zero(&r->z) & ~a->infinity;
    secp256k1_fe_add(&t, &q);                           /* t = Ralt^2 + Q (2) */
    r->x = t;                                           /* r->x = X3 = Ralt^2 + Q (2) */
    secp256k1_fe_mul_int(&t, 2);                        /* t = 2*X3 (4) */
    secp256k1_fe_add(&t, &q);                           /* t = 2*X3 + Q (5) */
    secp256k1_fe_mul(&t, &t, &rr_alt);                  /* t = Ralt*(2*X3 + Q) (1) */
    secp256k1_fe_add(&t, &n);                           /* t = Ralt*(2*X3 + Q) + M^3*Malt (3) */
    secp256k1_fe_negate(&r->y, &t, 3);                  /* r->y = -(Ralt*(2*X3 + Q) + M^3*Malt) (4) */
    secp256k1_fe_half(&r->y);                           /* r->y = Y3 = -(Ralt*(2*X3 + Q) + M^3*Malt)/2 (3) */

    /** In case a->infinity == 1, replace r with (b->x, b->y, 1). */
    secp256k1_fe_cmov(&r->x, &b->x, a->infinity);
    secp256k1_fe_cmov(&r->y, &b->y, a->infinity);
    secp256k1_fe_cmov(&r->z, &secp256k1_fe_one, a->infinity);
    r->infinity = infinity;
}